

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmodule.cpp
# Opt level: O0

kMatchResult
TestCaseMatch(vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
              *outMatches,string *tcPattern,
             vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
             *caseList)

{
  bool bVar1;
  const_reference pvVar2;
  element_type *peVar3;
  string *psVar4;
  bool isMatch_1;
  undefined1 local_68 [7];
  bool isMatch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> negTC;
  shared_ptr<trun::TestFunc> *testFunc;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
  *__range1;
  kMatchResult result;
  vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
  *caseList_local;
  string *tcPattern_local;
  vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
  *outMatches_local;
  
  __range1._4_4_ = List;
  __end1 = std::
           vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
           ::begin(caseList);
  testFunc = (shared_ptr<trun::TestFunc> *)
             std::
             vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
             ::end(caseList);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
                           (&__end1,(__normal_iterator<const_std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
                                     *)&testFunc), ((bVar1 ^ 0xffU) & 1) != 0) {
    negTC.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
         ::operator*(&__end1);
    bVar1 = std::operator==(tcPattern,"-");
    if (bVar1) {
      std::
      vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>::
      push_back(outMatches,(value_type *)negTC.field_2._8_8_);
    }
    else {
      pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](tcPattern,0);
      if (*pvVar2 == '!') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   tcPattern,1,0xffffffffffffffff);
        peVar3 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)negTC.field_2._8_8_);
        psVar4 = trun::TestFunc::CaseName_abi_cxx11_(peVar3);
        bVar1 = trun::match(psVar4,(string *)local_68);
        if (bVar1) {
          std::
          vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
          ::push_back(outMatches,(value_type *)negTC.field_2._8_8_);
          __range1._4_4_ = NegativeSingle;
        }
        std::__cxx11::string::~string((string *)local_68);
      }
      else {
        peVar3 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)negTC.field_2._8_8_);
        psVar4 = trun::TestFunc::CaseName_abi_cxx11_(peVar3);
        bVar1 = trun::match(psVar4,tcPattern);
        if (bVar1) {
          std::
          vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>
          ::push_back(outMatches,(value_type *)negTC.field_2._8_8_);
          __range1._4_4_ = Single;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<trun::TestFunc>_*,_std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

static kMatchResult TestCaseMatch(std::vector<TestFunc::Ref> &outMatches, const std::string &tcPattern, const std::vector<TestFunc::Ref> &caseList) {
    kMatchResult result = kMatchResult::List;
    for (auto &testFunc: caseList) {
        if (tcPattern == "-") {
            outMatches.push_back(testFunc);
        } else if (tcPattern[0]=='!') {
            auto negTC = tcPattern.substr(1);
            auto isMatch = trun::match(testFunc->CaseName(), negTC);
            if (isMatch) {
                // not sure...
                //executeFlag = 0;
                outMatches.push_back(testFunc);
                result = kMatchResult::NegativeSingle;
            }
        } else {
            auto isMatch = trun::match(testFunc->CaseName(), tcPattern);
            if (isMatch) {
                outMatches.push_back(testFunc);
                result = kMatchResult::Single;
            }
        }
    }

    return result;
}